

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

void __thiscall Model::RegisterPolymer(Model *this,Ptr *polymer)

{
  element_type *peVar1;
  shared_ptr<PolymerWrapper> wrapper;
  undefined1 local_49;
  PolymerWrapper *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  Ptr local_38;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_48 = (PolymerWrapper *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<PolymerWrapper,std::allocator<PolymerWrapper>,std::shared_ptr<Polymer>&>
            (&local_40,&local_48,(allocator<PolymerWrapper> *)&local_49,polymer);
  std::__shared_ptr<PolymerWrapper,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<PolymerWrapper,PolymerWrapper>
            ((__shared_ptr<PolymerWrapper,(__gnu_cxx::_Lock_policy)2> *)&local_48,local_48);
  peVar1 = (polymer->super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28 = local_48;
  local_20._M_pi = local_40._M_pi;
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
    }
  }
  (peVar1->wrapper_).super___weak_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar1->wrapper_).super___weak_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_20);
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  local_38.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_48->super_Reaction;
  local_38.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_40._M_pi;
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
    }
  }
  Gillespie::LinkReaction(&this->gillespie_,&local_38);
  if (local_38.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  return;
}

Assistant:

void Model::RegisterPolymer(Polymer::Ptr polymer) {
  // Encapsulate polymer in PolymerWrapper reaction and add to reaction list
  auto wrapper = std::make_shared<PolymerWrapper>(polymer);
  polymer->wrapper(wrapper);
  gillespie_.LinkReaction(wrapper);
}